

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_hmi.cpp
# Opt level: O0

bool midi_processor::process_hmi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  value_type vVar5;
  event_type p_type;
  value_type vVar6;
  uint uVar7;
  uint uVar8;
  reference puVar9;
  size_type sVar10;
  reference pvVar11;
  uchar *puVar12;
  uchar *puVar13;
  byte *pbVar14;
  reference pvVar15;
  difference_type dVar16;
  ulong uVar17;
  bool bVar18;
  midi_event local_490;
  uint local_44c;
  pointer pmStack_448;
  uint note_end_timestamp;
  int local_43c;
  undefined1 local_438 [4];
  int note_length;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3f8;
  uint local_3f0;
  event_type local_3ec;
  uint channel;
  event_type type;
  uint local_3dc;
  undefined1 local_3d8 [4];
  uint bytes_read;
  midi_event local_398;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_358;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_350;
  midi_event local_348;
  uchar *local_308;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_300;
  uchar *local_2f8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e8;
  pointer local_2e0;
  int local_2d4;
  undefined1 local_2d0 [4];
  int system_exclusive_count;
  uchar *local_290;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_288;
  uchar *local_280;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_278;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_270;
  pointer local_268;
  int local_25c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_258;
  int meta_count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  pointer local_248;
  int local_23c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_238;
  int delta;
  uint local_22c;
  undefined1 local_228 [4];
  uint32_t track_data_offset;
  uchar *local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  uchar *local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  uint local_1a4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_1a0;
  uint meta_size;
  uchar *local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  uint local_178;
  uint local_174;
  uint32_t meta_offset;
  uint last_event_timestamp;
  undefined1 local_168 [3];
  uchar last_event_code;
  uint current_timestamp;
  midi_track track_1;
  const_iterator track_end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  const_iterator track_body;
  unsigned_long track_length;
  uint track_offset;
  uint i_1;
  midi_event local_e8;
  undefined1 local_a8 [8];
  midi_track track;
  uint i;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> track_offsets;
  uint32_t track_table_offset;
  uint32_t track_count;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_container *p_out_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
  _track_table_offset = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_40 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&track_table_offset,0xe4);
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,0);
  uVar1 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,1);
  uVar2 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,2);
  uVar3 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,3);
  uVar7 = CONCAT13(*puVar9,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,4);
  uVar1 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,5);
  uVar2 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,6);
  uVar3 = *puVar9;
  puVar9 = __gnu_cxx::
           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](&local_40,7);
  uVar8 = CONCAT13(*puVar9,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
  sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
  if ((uVar8 < sVar10) &&
     (sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file),
     uVar8 + uVar7 * 4 <= sVar10)) {
    track_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
    local_40 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&track_offsets.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,(ulong)uVar7);
    for (track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (uint)track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < uVar7;
        track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&local_40,0);
      uVar1 = *puVar9;
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&local_40,1);
      uVar2 = *puVar9;
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&local_40,2);
      uVar3 = *puVar9;
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&local_40,3);
      uVar4 = *puVar9;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                           (ulong)(uint)track.m_events.
                                        super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar11 = CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_40,4);
    }
    midi_container::initialize(p_out,1,0xc0);
    midi_track::midi_track((midi_track *)local_a8);
    midi_event::midi_event(&local_e8,0,extended,0,hmp_default_tempo,5);
    midi_track::add_event((midi_track *)local_a8,&local_e8);
    midi_event::~midi_event(&local_e8);
    midi_event::midi_event((midi_event *)&track_offset,0,extended,0,end_of_track,2);
    midi_track::add_event((midi_track *)local_a8,(midi_event *)&track_offset);
    midi_event::~midi_event((midi_event *)&track_offset);
    midi_container::add_track(p_out,(midi_track *)local_a8);
    midi_track::~midi_track((midi_track *)local_a8);
    for (track_length._4_4_ = 0; track_length._4_4_ < uVar7;
        track_length._4_4_ = track_length._4_4_ + 1) {
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                           (ulong)track_length._4_4_);
      uVar8 = *pvVar11;
      if (track_length._4_4_ + 1 < uVar7) {
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                             (ulong)(track_length._4_4_ + 1));
        track_body._M_current = (uchar *)(ulong)(*pvVar11 - uVar8);
      }
      else {
        sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
        track_body._M_current = (uchar *)(sVar10 - uVar8);
      }
      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file);
      if ((sVar10 <= uVar8) ||
         (puVar12 = track_body._M_current + uVar8,
         puVar13 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(p_file)
         , puVar13 < puVar12)) {
        p_file_local._7_1_ = 0;
        goto LAB_0011fd57;
      }
      track_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
      local_140 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&track_end,(ulong)uVar8);
      track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_140,(difference_type)track_body._M_current);
      if (track_body._M_current < (uchar *)0xd) {
        p_file_local._7_1_ = 0;
        goto LAB_0011fd57;
      }
      puVar9 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](&local_140,0);
      if ((((((*puVar9 != 'H') ||
             (puVar9 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator[](&local_140,1), *puVar9 != 'M')) ||
            (puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,2), *puVar9 != 'I')) ||
           ((puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,3), *puVar9 != '-' ||
            (puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,4), *puVar9 != 'M')))) ||
          ((puVar9 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator[](&local_140,5), *puVar9 != 'I' ||
           ((puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,6), *puVar9 != 'D' ||
            (puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,7), *puVar9 != 'I')))))) ||
         ((puVar9 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[](&local_140,8), *puVar9 != 'T' ||
          ((((puVar9 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator[](&local_140,9), *puVar9 != 'R' ||
             (puVar9 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator[](&local_140,10), *puVar9 != 'A')) ||
            (puVar9 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[](&local_140,0xb), *puVar9 != 'C')) ||
           (puVar9 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator[](&local_140,0xc), *puVar9 != 'K')))))) {
        p_file_local._7_1_ = 0;
        goto LAB_0011fd57;
      }
      midi_track::midi_track((midi_track *)local_168);
      last_event_timestamp = 0;
      meta_offset._3_1_ = 0xff;
      local_174 = 0;
      if (track_body._M_current < (uchar *)0x4f) {
        p_file_local._7_1_ = 0;
        bVar18 = true;
      }
      else {
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](&local_140,0x4b);
        uVar1 = *puVar9;
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](&local_140,0x4c);
        uVar2 = *puVar9;
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](&local_140,0x4d);
        uVar3 = *puVar9;
        puVar9 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](&local_140,0x4e);
        local_178 = CONCAT13(*puVar9,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
        if ((local_178 != 0) && ((uchar *)(ulong)(local_178 + 1) < track_body._M_current)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,2);
          local_180 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_140,(ulong)local_178);
          local_190 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_140,(ulong)local_178);
          local_188 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_190,2);
          local_198 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &it);
          _Stack_1a0 = std::
                       copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                 (local_180,local_188,
                                  (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_198);
          pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,1);
          local_1a4 = (uint)*pbVar14;
          if (track_body._M_current < (uchar *)(ulong)(local_178 + 2 + local_1a4)) {
            p_file_local._7_1_ = 0;
            bVar18 = true;
            goto LAB_0011fd13;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                     (ulong)(local_1a4 + 2));
          local_1b8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_140,(ulong)local_178);
          local_1b0 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_1b8,2);
          local_1d0 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_140,(ulong)local_178);
          local_1c8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_1d0,2);
          local_1c0 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_1c8,(ulong)local_1a4);
          local_1e0._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
          local_1d8 = (uchar *)__gnu_cxx::
                               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ::operator+(&local_1e0,2);
          local_1e8 = (uchar *)std::
                               copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                         (local_1b0,local_1c0,
                                          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           )local_1d8);
          while( true ) {
            bVar18 = false;
            if (local_1a4 != 0) {
              pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                   (ulong)(local_1a4 + 1));
              bVar18 = *pvVar15 == ' ';
            }
            if (!bVar18) break;
            local_1a4 = local_1a4 - 1;
          }
          if (local_1a4 != 0) {
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
            *pvVar15 = 0xff;
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,1);
            *pvVar15 = '\x01';
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
            midi_event::midi_event
                      ((midi_event *)local_228,0,extended,0,pvVar15,(ulong)(local_1a4 + 2));
            midi_track::add_event((midi_track *)local_168,(midi_event *)local_228);
            midi_event::~midi_event((midi_event *)local_228);
          }
        }
        if (track_body._M_current < (uchar *)0x5b) {
          p_file_local._7_1_ = 0;
          bVar18 = true;
        }
        else {
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](&local_140,0x57);
          uVar1 = *puVar9;
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](&local_140,0x58);
          uVar2 = *puVar9;
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](&local_140,0x59);
          uVar3 = *puVar9;
          puVar9 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator[](&local_140,0x5a);
          local_22c = CONCAT13(*puVar9,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
          _Stack_238 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_140,(ulong)local_22c);
          local_40 = _Stack_238;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,3);
          do {
            while( true ) {
              bVar18 = __gnu_cxx::operator!=
                                 (&local_40,
                                  (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&track_1.m_events.
                                      super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (!bVar18) goto LAB_0011fcfa;
              local_248 = track_1.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              local_23c = decode_delta(&local_40,
                                       (const_iterator)
                                       track_1.m_events.
                                       super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((local_23c < 0x10000) && (-1 < local_23c)) {
                last_event_timestamp = local_23c + last_event_timestamp;
                if (local_174 < last_event_timestamp) {
                  local_174 = last_event_timestamp;
                }
              }
              else {
                last_event_timestamp = local_174;
              }
              bVar18 = __gnu_cxx::operator==
                                 (&local_40,
                                  (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&track_1.m_events.
                                      super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar18) {
                p_file_local._7_1_ = 0;
                bVar18 = true;
                goto LAB_0011fd13;
              }
              local_250 = __gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator++(&local_40,0);
              puVar9 = __gnu_cxx::
                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator*(&local_250);
              uVar1 = *puVar9;
              pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
              *pvVar15 = uVar1;
              pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
              if (*pvVar15 == 0xff) break;
              pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
              if (*pvVar15 == 0xf0) {
                meta_offset._3_1_ = 0xff;
                local_2e0 = track_1.m_events.
                            super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                local_2d4 = decode_delta(&local_40,
                                         (const_iterator)
                                         track_1.m_events.
                                         super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (local_2d4 < 0) {
                  p_file_local._7_1_ = 0;
                  bVar18 = true;
                  goto LAB_0011fd13;
                }
                dVar16 = __gnu_cxx::operator-
                                   ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)&track_1.m_events.
                                        super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,&local_40)
                ;
                if (dVar16 < local_2d4) {
                  p_file_local._7_1_ = 0;
                  bVar18 = true;
                  goto LAB_0011fd13;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                           (long)(local_2d4 + 1));
                local_2e8._M_current = local_40._M_current;
                local_2f0 = __gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+(&local_40,(long)local_2d4);
                local_300._M_current =
                     (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it);
                local_2f8 = (uchar *)__gnu_cxx::
                                     __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     ::operator+(&local_300,1);
                local_308 = (uchar *)std::
                                     copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                               (local_2e8,local_2f0,
                                                (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                 )local_2f8);
                __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+=(&local_40,(long)local_2d4);
                uVar17 = (ulong)last_event_timestamp;
                pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0)
                ;
                midi_event::midi_event(&local_348,uVar17,extended,0,pvVar15,(long)(local_2d4 + 1));
                midi_track::add_event((midi_track *)local_168,&local_348);
                midi_event::~midi_event(&local_348);
              }
              else {
                pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0)
                ;
                if (*pvVar15 == 0xfe) {
                  meta_offset._3_1_ = 0xff;
                  bVar18 = __gnu_cxx::operator==
                                     (&local_40,
                                      (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&track_1.m_events.
                                          super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (bVar18) {
                    p_file_local._7_1_ = 0;
                    bVar18 = true;
                    goto LAB_0011fd13;
                  }
                  local_350 = __gnu_cxx::
                              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::operator++(&local_40,0);
                  puVar9 = __gnu_cxx::
                           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator*(&local_350);
                  uVar1 = *puVar9;
                  pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       1);
                  *pvVar15 = uVar1;
                  pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       1);
                  if (*pvVar15 == '\x10') {
                    dVar16 = __gnu_cxx::operator-
                                       ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&track_1.m_events.
                                            super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        &local_40);
                    if (dVar16 < 3) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+=(&local_40,2);
                    local_358 = __gnu_cxx::
                                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::operator++(&local_40,0);
                    puVar9 = __gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator*(&local_358);
                    uVar1 = *puVar9;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,2);
                    *pvVar15 = uVar1;
                    dVar16 = __gnu_cxx::operator-
                                       ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&track_1.m_events.
                                            super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        &local_40);
                    pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,2);
                    if (dVar16 < (int)(*pbVar14 + 4)) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,2);
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+=(&local_40,(long)(int)(*pbVar14 + 4));
                  }
                  else {
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,1);
                    if (*pvVar15 == '\x12') {
                      dVar16 = __gnu_cxx::operator-
                                         ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                           *)&track_1.m_events.
                                              super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          &local_40);
                      if (dVar16 < 2) {
                        p_file_local._7_1_ = 0;
                        bVar18 = true;
                        goto LAB_0011fd13;
                      }
                      __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+=(&local_40,2);
                    }
                    else {
                      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &it,1);
                      if (*pvVar15 == '\x13') {
                        dVar16 = __gnu_cxx::operator-
                                           ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             *)&track_1.m_events.
                                                super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            &local_40);
                        if (dVar16 < 10) {
                          p_file_local._7_1_ = 0;
                          bVar18 = true;
                          goto LAB_0011fd13;
                        }
                        __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+=(&local_40,10);
                      }
                      else {
                        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&it,1);
                        if (*pvVar15 == '\x14') {
                          dVar16 = __gnu_cxx::operator-
                                             ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               *)&track_1.m_events.
                                                  super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ,&local_40);
                          if (dVar16 < 2) {
                            p_file_local._7_1_ = 0;
                            bVar18 = true;
                            goto LAB_0011fd13;
                          }
                          __gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+=(&local_40,2);
                          midi_event::midi_event
                                    (&local_398,(ulong)last_event_timestamp,extended,0,loop_start,
                                     0xb);
                          midi_container::add_track_event(p_out,0,&local_398);
                          midi_event::~midi_event(&local_398);
                        }
                        else {
                          pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&it,1);
                          if (*pvVar15 != '\x15') {
                            p_file_local._7_1_ = 0;
                            bVar18 = true;
                            goto LAB_0011fd13;
                          }
                          dVar16 = __gnu_cxx::operator-
                                             ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               *)&track_1.m_events.
                                                  super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              ,&local_40);
                          if (dVar16 < 6) {
                            p_file_local._7_1_ = 0;
                            bVar18 = true;
                            goto LAB_0011fd13;
                          }
                          __gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+=(&local_40,6);
                          midi_event::midi_event
                                    ((midi_event *)local_3d8,(ulong)last_event_timestamp,extended,0,
                                     loop_end,9);
                          midi_container::add_track_event(p_out,0,(midi_event *)local_3d8);
                          midi_event::~midi_event((midi_event *)local_3d8);
                        }
                      }
                    }
                  }
                }
                else {
                  pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       0);
                  if (0xef < *pbVar14) {
                    p_file_local._7_1_ = 0;
                    bVar18 = true;
                    goto LAB_0011fd13;
                  }
                  local_3dc = 1;
                  pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       0);
                  if (*pbVar14 < 0x80) {
                    if (meta_offset._3_1_ == 0xff) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,0);
                    vVar5 = *pvVar15;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,1);
                    vVar6 = meta_offset._3_1_;
                    *pvVar15 = vVar5;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,0);
                    *pvVar15 = vVar6;
                  }
                  else {
                    bVar18 = __gnu_cxx::operator==
                                       (&local_40,
                                        (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&track_1.m_events.
                                            super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (bVar18) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    _channel = __gnu_cxx::
                               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ::operator++(&local_40,0);
                    puVar9 = __gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                          *)&channel);
                    uVar1 = *puVar9;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,1);
                    *pvVar15 = uVar1;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,0);
                    meta_offset._3_1_ = *pvVar15;
                  }
                  pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       0);
                  local_3ec = ((int)(uint)*pbVar14 >> 4) + ~extended;
                  pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       0);
                  local_3f0 = *pbVar14 & 0xf;
                  if ((local_3ec != program_change) && (local_3ec != channel_aftertouch)) {
                    bVar18 = __gnu_cxx::operator==
                                       (&local_40,
                                        (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&track_1.m_events.
                                            super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (bVar18) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    local_3f8 = __gnu_cxx::
                                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                ::operator++(&local_40,0);
                    puVar9 = __gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator*(&local_3f8);
                    uVar1 = *puVar9;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,2);
                    *pvVar15 = uVar1;
                    local_3dc = 2;
                  }
                  p_type = local_3ec;
                  uVar8 = local_3f0;
                  uVar17 = (ulong)last_event_timestamp;
                  pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                                       1);
                  midi_event::midi_event
                            ((midi_event *)local_438,uVar17,p_type,uVar8,pvVar15,(ulong)local_3dc);
                  midi_track::add_event((midi_track *)local_168,(midi_event *)local_438);
                  midi_event::~midi_event((midi_event *)local_438);
                  if (local_3ec == note_on) {
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,2);
                    *pvVar15 = '\0';
                    pmStack_448 = track_1.m_events.
                                  super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_43c = decode_delta(&local_40,
                                             (const_iterator)
                                             track_1.m_events.
                                             super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    uVar8 = local_3f0;
                    if (local_43c < 0) {
                      p_file_local._7_1_ = 0;
                      bVar18 = true;
                      goto LAB_0011fd13;
                    }
                    local_44c = last_event_timestamp + local_43c;
                    if (local_174 < local_44c) {
                      local_174 = local_44c;
                    }
                    uVar17 = (ulong)local_44c;
                    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &it,1);
                    midi_event::midi_event(&local_490,uVar17,note_on,uVar8,pvVar15,(ulong)local_3dc)
                    ;
                    midi_track::add_event((midi_track *)local_168,&local_490);
                    midi_event::~midi_event(&local_490);
                  }
                }
              }
            }
            meta_offset._3_1_ = 0xff;
            bVar18 = __gnu_cxx::operator==
                               (&local_40,
                                (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&track_1.m_events.
                                    super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar18) {
              p_file_local._7_1_ = 0;
              bVar18 = true;
              goto LAB_0011fd13;
            }
            _Stack_258 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator++(&local_40,0);
            puVar9 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator*(&stack0xfffffffffffffda8);
            uVar1 = *puVar9;
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,1);
            *pvVar15 = uVar1;
            local_268 = track_1.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_25c = decode_delta(&local_40,
                                     (const_iterator)
                                     track_1.m_events.
                                     super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (local_25c < 0) {
              p_file_local._7_1_ = 0;
              bVar18 = true;
              goto LAB_0011fd13;
            }
            dVar16 = __gnu_cxx::operator-
                               ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&track_1.m_events.
                                    super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_40);
            if (dVar16 < local_25c) {
              p_file_local._7_1_ = 0;
              bVar18 = true;
              goto LAB_0011fd13;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,
                       (long)(local_25c + 2));
            local_270._M_current = local_40._M_current;
            local_278 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_40,(long)local_25c);
            local_288._M_current =
                 (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
            local_280 = (uchar *)__gnu_cxx::
                                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ::operator+(&local_288,2);
            local_290 = (uchar *)std::
                                 copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                           (local_270,local_278,
                                            (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             )local_280);
            __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator+=(&local_40,(long)local_25c);
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,1);
            if ((*pvVar15 == '/') && (last_event_timestamp < local_174)) {
              last_event_timestamp = local_174;
            }
            uVar17 = (ulong)last_event_timestamp;
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,0);
            midi_event::midi_event
                      ((midi_event *)local_2d0,uVar17,extended,0,pvVar15,(long)(local_25c + 2));
            midi_track::add_event((midi_track *)local_168,(midi_event *)local_2d0);
            midi_event::~midi_event((midi_event *)local_2d0);
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it,1);
          } while (*pvVar15 != '/');
LAB_0011fcfa:
          midi_container::add_track(p_out,(midi_track *)local_168);
          bVar18 = false;
        }
      }
LAB_0011fd13:
      midi_track::~midi_track((midi_track *)local_168);
      if (bVar18) goto LAB_0011fd57;
    }
    p_file_local._7_1_ = 1;
LAB_0011fd57:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  }
  else {
    p_file_local._7_1_ = 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&it);
  return (bool)(p_file_local._7_1_ & 1);
}

Assistant:

bool midi_processor::process_hmi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    std::vector<uint8_t> buffer;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 0xE4;

    uint32_t track_count        = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
    uint32_t track_table_offset = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );

    if ( track_table_offset >= p_file.size() || track_table_offset + track_count * 4 > p_file.size() )
        return false;

    it = p_file.begin() + track_table_offset;

    std::vector<uint32_t> track_offsets;
    track_offsets.resize( track_count );

    for ( unsigned i = 0; i < track_count; ++i )
    {
        track_offsets[ i ] = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
        it += 4;
    }

    p_out.initialize( 1, 0xC0 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, hmp_default_tempo, _countof( hmp_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    for ( unsigned i = 0; i < track_count; ++i )
    {
        unsigned track_offset = track_offsets[ i ];
        unsigned long track_length;
        if ( i + 1 < track_count )
        {
            track_length = track_offsets[ i + 1 ] - track_offset;
        }
        else
        {
            track_length = p_file.size() - track_offset;
        }
        if ( track_offset >= p_file.size() || track_offset + track_length > p_file.size() )
            return false;

        std::vector<uint8_t>::const_iterator track_body = p_file.begin() + track_offset;
        std::vector<uint8_t>::const_iterator track_end = track_body + track_length;

        if ( track_length < 13 ) return false;
        if ( track_body[ 0 ] != 'H' || track_body[ 1 ] != 'M' || track_body[ 2 ] != 'I' || track_body[ 3 ] != '-' ||
             track_body[ 4 ] != 'M' || track_body[ 5 ] != 'I' || track_body[ 6 ] != 'D' || track_body[ 7 ] != 'I' ||
             track_body[ 8 ] != 'T' || track_body[ 9 ] != 'R' || track_body[ 10 ] != 'A' || track_body[ 11 ] != 'C' ||
             track_body[ 12 ] != 'K' ) return false;

        midi_track track;
        unsigned current_timestamp = 0;
        unsigned char last_event_code = 0xFF;

        unsigned last_event_timestamp = 0;

        if ( track_length < 0x4B + 4 ) return false;

        uint32_t meta_offset = track_body[ 0x4B ] | ( track_body[ 0x4C ] << 8 ) | ( track_body[ 0x4D ] << 16 ) | ( track_body[ 0x4E ] << 24 );
        if ( meta_offset && meta_offset + 1 < track_length )
        {
            buffer.resize( 2 );
            std::copy( track_body + meta_offset, track_body + meta_offset + 2, buffer.begin() );
            unsigned meta_size = buffer[ 1 ];
            if ( meta_offset + 2 + meta_size > track_length ) return false;
            buffer.resize( meta_size + 2 );
            std::copy( track_body + meta_offset + 2, track_body + meta_offset + 2 + meta_size, buffer.begin() + 2 );
            while ( meta_size > 0 && buffer[ meta_size + 1 ] == ' ' ) --meta_size;
            if ( meta_size > 0 )
            {
                buffer[ 0 ] = 0xFF;
                buffer[ 1 ] = 0x01;
                track.add_event( midi_event( 0, midi_event::extended, 0, &buffer[0], meta_size + 2 ) );
            }
        }

        if ( track_length < 0x57 + 4 ) return false;

        uint32_t track_data_offset = track_body[ 0x57 ] | ( track_body[ 0x58 ] << 8 ) | ( track_body[ 0x59 ] << 16 ) | ( track_body[ 0x5A ] << 24 );

        it = track_body + track_data_offset;

        buffer.resize( 3 );

        while ( it != track_end )
        {
            int delta = decode_delta( it, track_end );
            if ( delta > 0xFFFF || delta < 0 )
            {
                current_timestamp = last_event_timestamp;
                /*console::formatter() << "[foo_midi] Large HMI delta detected, shunting.";*/
            }
            else
            {
                current_timestamp += delta;
                if ( current_timestamp > last_event_timestamp )
                {
                    last_event_timestamp = current_timestamp;
                }
            }

            if ( it == track_end ) return false;
            buffer[ 0 ] = *it++;
            if ( buffer[ 0 ] == 0xFF )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                int meta_count = decode_delta( it, track_end );
                if ( meta_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI meta message" );*/
                if ( track_end - it < meta_count ) return false;
                buffer.resize( meta_count + 2 );
                std::copy( it, it + meta_count, buffer.begin() + 2 );
                it += meta_count;
                if ( buffer[ 1 ] == 0x2F && last_event_timestamp > current_timestamp )
                {
                    current_timestamp = last_event_timestamp;
                }
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], meta_count + 2 ) );
                if ( buffer[ 1 ] == 0x2F ) break;
            }
            else if ( buffer[ 0 ] == 0xF0 )
            {
                last_event_code = 0xFF;
                int system_exclusive_count = decode_delta( it, track_end );
                if ( system_exclusive_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI System Exclusive message" );*/
                if ( track_end - it < system_exclusive_count ) return false;
                buffer.resize( system_exclusive_count + 1 );
                std::copy( it, it + system_exclusive_count, buffer.begin() + 1 );
                it += system_exclusive_count;
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], system_exclusive_count + 1 ) );
            }
            else if ( buffer[ 0 ] == 0xFE )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                if ( buffer[ 1 ] == 0x10 )
                {
                    if ( track_end - it < 3 ) return false;
                    it += 2;
                    buffer[ 2 ] = *it++;
                    if ( track_end - it < buffer[ 2 ] + 4 ) return false;
                    it += buffer[ 2 ] + 4;
                }
                else if ( buffer[ 1 ] == 0x12 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                }
                else if ( buffer[ 1 ] == 0x13 )
                {
                    if ( track_end - it < 10 ) return false;
                    it += 10;
                }
                else if ( buffer[ 1 ] == 0x14 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_start, _countof( loop_start ) ) );
                }
                else if ( buffer[ 1 ] == 0x15 )
                {
                    if ( track_end - it < 6 ) return false;
                    it += 6;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_end, _countof( loop_end ) ) );
                }
                else return false; /*throw exception_io_data( "Unexpected HMI meta event" );*/
            }
            else if ( buffer[ 0 ] <= 0xEF )
            {
                unsigned bytes_read = 1;
                if ( buffer[ 0 ] >= 0x80 )
                {
                    if ( it == track_end ) return false;
                    buffer[ 1 ] = *it++;
                    last_event_code = buffer[ 0 ];
                }
                else
                {
                    if ( last_event_code == 0xFF ) return false; /*throw exception_io_data( "HMI used shortened event after Meta or SysEx message" );*/
                    buffer[ 1 ] = buffer[ 0 ];
                    buffer[ 0 ] = last_event_code;
                }
                midi_event::event_type type = (midi_event::event_type)( ( buffer[ 0 ] >> 4 ) - 8 );
                unsigned channel = buffer[ 0 ] & 0x0F;
                if ( type != midi_event::program_change && type != midi_event::channel_aftertouch )
                {
                    if ( it == track_end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_read = 2;
                }
                track.add_event( midi_event( current_timestamp, type, channel, &buffer[ 1 ], bytes_read ) );
                if ( type == midi_event::note_on )
                {
                    buffer[ 2 ] = 0x00;
                    int note_length = decode_delta( it, track_end );
                    if ( note_length < 0 ) return false; /*throw exception_io_data( "Invalid HMI note message" );*/
                    unsigned note_end_timestamp = current_timestamp + note_length;
                    if ( note_end_timestamp > last_event_timestamp ) last_event_timestamp = note_end_timestamp;
                    track.add_event( midi_event( note_end_timestamp, midi_event::note_on, channel, &buffer[1], bytes_read ) );
                }
            }
            else return false; /*throw exception_io_data( "Unexpected HMI status code" );*/
        }

        p_out.add_track( track );
    }

    return true;
}